

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void sqlite3_result_text64
               (sqlite3_context *pCtx,char *z,sqlite3_uint64 n,_func_void_void_ptr *xDel,uchar enc)

{
  u8 enc_00;
  
  if (n >> 0x1f != 0) {
    invokeValueDestructor(z,xDel,pCtx);
    return;
  }
  enc_00 = '\x02';
  if (enc != '\x04') {
    enc_00 = enc;
  }
  setResultStrOrError(pCtx,z,(int)n,enc_00,xDel);
  return;
}

Assistant:

SQLITE_API void sqlite3_result_text64(
  sqlite3_context *pCtx,
  const char *z,
  sqlite3_uint64 n,
  void (*xDel)(void *),
  unsigned char enc
){
  assert( sqlite3_mutex_held(pCtx->pOut->db->mutex) );
  assert( xDel!=SQLITE_DYNAMIC );
  if( enc==SQLITE_UTF16 ) enc = SQLITE_UTF16NATIVE;
  if( n>0x7fffffff ){
    (void)invokeValueDestructor(z, xDel, pCtx);
  }else{
    setResultStrOrError(pCtx, z, (int)n, enc, xDel);
  }
}